

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall glu::sl::ShaderParser::~ShaderParser(ShaderParser *this)

{
  ShaderParser *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_curTokenStr);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_input);
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniquePtr
            (&this->m_resource);
  std::__cxx11::string::~string((string *)&this->m_filename);
  return;
}

Assistant:

ShaderParser::~ShaderParser (void)
{
}